

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboRenderTest.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::Framebuffer::destroyBuffer(Framebuffer *this,deUint32 name,GLenum type)

{
  long lVar1;
  undefined1 local_4 [4];
  
  lVar1 = 0x40;
  if ((type != 0xde1) && (type != 0x8513)) {
    if (type != 0x8d41) {
      return;
    }
    lVar1 = 0x70;
  }
  (**(code **)((long)this->m_context->_vptr_Context + lVar1))(this->m_context,1,local_4);
  return;
}

Assistant:

void Framebuffer::destroyBuffer (deUint32 name, GLenum type)
{
	if (type == GL_TEXTURE_2D || type == GL_TEXTURE_CUBE_MAP)
		m_context.deleteTextures(1, &name);
	else if (type == GL_RENDERBUFFER)
		m_context.deleteRenderbuffers(1, &name);
	else
		DE_ASSERT(type == GL_NONE);
}